

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O0

SUNErrCode
SUNDataNode_CreateList_InMem
          (sundataindex init_size,SUNContext_conflict sunctx,SUNDataNode *node_out)

{
  SUNProfiler destroyValue;
  SUNStlVector_SUNDataNode pSVar1;
  SUNContext_conflict in_RDX;
  int64_t in_RSI;
  SUNDataNode node;
  SUNContext_conflict sunctx_local_scope_;
  SUNErrCode local_4;
  
  destroyValue = (SUNProfiler)sunDataNode_CreateCommon_InMem(in_RDX);
  *(SUNDataNodeType *)&destroyValue->title = SUNDATANODE_LIST;
  pSVar1 = SUNStlVector_SUNDataNode_New(in_RSI,(_func_SUNErrCode_SUNDataNode_ptr *)destroyValue);
  destroyValue->map[3].destroyKeyValue = (_func_SUNErrCode_SUNHashMapKeyValue_ptr *)pSVar1;
  if (destroyValue->map[3].destroyKeyValue == (_func_SUNErrCode_SUNHashMapKeyValue_ptr *)0x0) {
    sunDataNode_DestroyCommon_InMem((SUNDataNode *)0x1078f3);
    local_4 = -0x2705;
  }
  else {
    in_RDX->profiler = destroyValue;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNDataNode_CreateList_InMem(sundataindex init_size,
                                        SUNContext sunctx, SUNDataNode* node_out)
{
  SUNFunctionBegin(sunctx);

  SUNDataNode node = sunDataNode_CreateCommon_InMem(sunctx);

  BASE_MEMBER(node, dtype) = SUNDATANODE_LIST;
  IMPL_MEMBER(node, anon_children) =
    SUNStlVector_SUNDataNode_New(init_size, sunDataNode_FreeValue_InMem);
  if (IMPL_MEMBER(node, anon_children) == NULL)
  {
    sunDataNode_DestroyCommon_InMem(&node);
    return SUN_ERR_MEM_FAIL;
  }

  *node_out = node;
  return SUN_SUCCESS;
}